

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsCoreAddSourceFilterToEndpoint
               (HelicsCore core,char *filter,char *endpoint,HelicsError *err)

{
  Core *pCVar1;
  size_t sVar2;
  size_t sVar3;
  
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    if (filter != (char *)0x0 && endpoint != (char *)0x0) {
      sVar2 = strlen(filter);
      sVar3 = strlen(endpoint);
      (*pCVar1->_vptr_Core[0x48])(pCVar1,sVar2,filter,sVar3,endpoint,pCVar1->_vptr_Core[0x48]);
      return;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "Data link arguments cannot be null";
    }
  }
  return;
}

Assistant:

void helicsCoreAddSourceFilterToEndpoint(HelicsCore core, const char* filter, const char* endpoint, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    if ((filter == nullptr) || (endpoint == nullptr)) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidDataLinkString);
        return;
    }
    cppcore->addSourceFilterToEndpoint(filter, endpoint);
}